

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

RegSlot __thiscall ByteCodeGenerator::AssignTrueConstRegister(ByteCodeGenerator *this)

{
  RegSlot RVar1;
  Type *ppFVar2;
  FuncInfo *top;
  ByteCodeGenerator *this_local;
  
  ppFVar2 = SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Top(this->funcInfoStack);
  RVar1 = FuncInfo::AssignTrueConstRegister(*ppFVar2);
  return RVar1;
}

Assistant:

Js::RegSlot ByteCodeGenerator::AssignTrueConstRegister()
{
    FuncInfo *top = funcInfoStack->Top();
    return top->AssignTrueConstRegister();
}